

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void MarkReachableBlocks(VmBlock *block)

{
  VmBlock **ppVVar1;
  uint i;
  uint index;
  
  if (block->visited == false) {
    block->visited = true;
    for (index = 0; index < (block->successors).count; index = index + 1) {
      ppVVar1 = SmallArray<VmBlock_*,_4U>::operator[](&block->successors,index);
      MarkReachableBlocks(*ppVVar1);
    }
  }
  return;
}

Assistant:

void MarkReachableBlocks(VmBlock *block)
{
	if(block->visited)
		return;

	block->visited = true;

	for(unsigned i = 0; i < block->successors.size(); i++)
		MarkReachableBlocks(block->successors[i]);
}